

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenInitializer::AddToSourceGroup
          (cmQtAutoGenInitializer *this,string *fileName,string *genNameUpper)

{
  bool bVar1;
  cmMakefile *this_00;
  string *this_01;
  iterator pvVar2;
  cmState *this_02;
  ulong uVar3;
  string local_138;
  undefined1 local_118 [8];
  string err;
  char *propName;
  string *prop;
  iterator __end2;
  iterator __begin2;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  undefined1 local_b8 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> props;
  string groupName;
  string property;
  cmSourceGroup *sourceGroup;
  cmMakefile *makefile;
  string *genNameUpper_local;
  string *fileName_local;
  cmQtAutoGenInitializer *this_local;
  
  this_00 = cmTarget::GetMakefile(this->Target->Target);
  property.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(groupName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(props._M_elems[1].field_2._M_local_buf + 8));
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  __range2._2_1_ = 1;
  std::operator+(local_c0,genNameUpper,"_SOURCE_GROUP");
  this_01 = (string *)(props._M_elems[0].field_2._M_local_buf + 8);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,"AUTOGEN_SOURCE_GROUP",(allocator<char> *)((long)&__range2 + 3));
  __range2._2_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 3));
  __end2 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
           ::begin((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                    *)local_b8);
  pvVar2 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
           ::end((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                  *)local_b8);
  do {
    if (__end2 == pvVar2) {
LAB_004ee233:
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)local_b8);
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) == 0) &&
         (property.field_2._8_8_ =
               cmMakefile::GetOrCreateSourceGroup
                         (this_00,(string *)((long)&props._M_elems[1].field_2 + 8)),
         (cmSourceGroup *)property.field_2._8_8_ == (cmSourceGroup *)0x0)) {
        std::__cxx11::string::string((string *)local_118);
        std::__cxx11::string::operator+=((string *)local_118,(string *)genNameUpper);
        std::__cxx11::string::operator+=((string *)local_118," error in ");
        std::__cxx11::string::operator+=
                  ((string *)local_118,(string *)(groupName.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=
                  ((string *)local_118,": Could not find or create the source group ");
        cmQtAutoGen::Quoted(&local_138,(string *)((long)&props._M_elems[1].field_2 + 8));
        std::__cxx11::string::operator+=((string *)local_118,(string *)&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        cmSystemTools::Error((string *)local_118);
        this_local._7_1_ = 0;
        bVar1 = true;
        std::__cxx11::string::~string((string *)local_118);
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)(props._M_elems[1].field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(groupName.field_2._M_local_buf + 8));
      if (!bVar1) {
        if (property.field_2._8_8_ != 0) {
          cmSourceGroup::AddGroupFile((cmSourceGroup *)property.field_2._8_8_,fileName);
        }
        this_local._7_1_ = 1;
      }
      return (bool)(this_local._7_1_ & 1);
    }
    this_02 = cmMakefile::GetState(this_00);
    err.field_2._8_8_ = cmState::GetGlobalProperty(this_02,__end2);
    if (((char *)err.field_2._8_8_ != (char *)0x0) && (*(char *)err.field_2._8_8_ != '\0')) {
      std::__cxx11::string::operator=
                ((string *)(props._M_elems[1].field_2._M_local_buf + 8),(char *)err.field_2._8_8_);
      std::__cxx11::string::operator=
                ((string *)(groupName.field_2._M_local_buf + 8),(string *)__end2);
      goto LAB_004ee233;
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

bool cmQtAutoGenInitializer::AddToSourceGroup(std::string const& fileName,
                                              std::string const& genNameUpper)
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  cmSourceGroup* sourceGroup = nullptr;
  // Acquire source group
  {
    std::string property;
    std::string groupName;
    {
      // Prefer generator specific source group name
      std::array<std::string, 2> props{ { genNameUpper + "_SOURCE_GROUP",
                                          "AUTOGEN_SOURCE_GROUP" } };
      for (std::string& prop : props) {
        const char* propName = makefile->GetState()->GetGlobalProperty(prop);
        if ((propName != nullptr) && (*propName != '\0')) {
          groupName = propName;
          property = std::move(prop);
          break;
        }
      }
    }
    // Generate a source group on demand
    if (!groupName.empty()) {
      sourceGroup = makefile->GetOrCreateSourceGroup(groupName);
      if (sourceGroup == nullptr) {
        std::string err;
        err += genNameUpper;
        err += " error in ";
        err += property;
        err += ": Could not find or create the source group ";
        err += cmQtAutoGen::Quoted(groupName);
        cmSystemTools::Error(err);
        return false;
      }
    }
  }
  if (sourceGroup != nullptr) {
    sourceGroup->AddGroupFile(fileName);
  }
  return true;
}